

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O0

void * matras_alloc(matras *m,matras_id_t *result_id)

{
  size_t sVar1;
  void *res;
  matras_id_t *result_id_local;
  matras *m_local;
  
  if (m->capacity < (m->head).block_count) {
    __assert_fail("m->head.block_count <= m->capacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0xf7,"void *matras_alloc(struct matras *, matras_id_t *)");
  }
  if ((m->head).block_count == m->capacity) {
    m_local = (matras *)0x0;
  }
  else {
    m_local = (matras *)matras_alloc_internal(m);
    if (m_local != (matras *)0x0) {
      sVar1 = (m->head).block_count;
      (m->head).block_count = sVar1 + 1;
      *result_id = (matras_id_t)sVar1;
    }
  }
  return m_local;
}

Assistant:

void *
matras_alloc(struct matras *m, matras_id_t *result_id)
{
	assert(m->head.block_count <= m->capacity);

	if (m->head.block_count == m->capacity) {
		/* Matras is completely full. */
		return NULL;
	}
	void *res = matras_alloc_internal(m);
	if (res != NULL)
		*result_id = m->head.block_count++;
	return res;
}